

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  ipc_pipe *p;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x608));
  if ((*(byte *)((long)arg + 0x18) & 1) == 0) {
    _Var1 = nni_aio_start(aio,ipc_pipe_recv_cancel,arg);
    if (_Var1) {
      nni_list_append((nni_list *)((long)arg + 0x78),aio);
      pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
      if (pnVar2 == aio) {
        ipc_pipe_recv_start((ipc_pipe *)arg);
      }
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
    }
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x608));
    nni_aio_finish_error(aio,NNG_ECLOSED);
  }
  return;
}

Assistant:

static void
ipc_pipe_recv(void *arg, nni_aio *aio)
{
	ipc_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (p->closed) {
		nni_mtx_unlock(&p->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, ipc_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}

	nni_list_append(&p->recv_q, aio);
	if (nni_list_first(&p->recv_q) == aio) {
		ipc_pipe_recv_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}